

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dthinker.cpp
# Opt level: O1

void DThinker::DestroyAllThinkers(void)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    if (lVar1 != 0x20) {
      DestroyThinkersInList((FThinkerList *)((long)&Thinkers[0].Sentinel + lVar1));
      DestroyThinkersInList((FThinkerList *)((long)&FreshThinkers[0].Sentinel + lVar1));
    }
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x400);
  DestroyThinkersInList(Thinkers + 0x80);
  GC::FullGC();
  return;
}

Assistant:

void DThinker::DestroyAllThinkers ()
{
	int i;

	for (i = 0; i <= MAX_STATNUM; i++)
	{
		if (i != STAT_TRAVELLING)
		{
			DestroyThinkersInList (Thinkers[i]);
			DestroyThinkersInList (FreshThinkers[i]);
		}
	}
	DestroyThinkersInList (Thinkers[MAX_STATNUM+1]);
	GC::FullGC();
}